

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_error.c
# Opt level: O0

void eprintf(char *fmt,char *file,int line,...)

{
  FILE *__stream;
  char in_AL;
  size_t sVar1;
  int *piVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  va_list args;
  int line_local;
  char *file_local;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  args[0].reg_save_area._4_4_ = line;
  fflush(_stderr);
  fprintf(_stderr,"%s:%d: ",file,(ulong)args[0].reg_save_area._4_4_);
  args[0].overflow_arg_area = local_e8;
  args[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  vfprintf(_stderr,fmt,&local_38);
  if (*fmt != '\0') {
    sVar1 = strlen(fmt);
    __stream = _stderr;
    if (fmt[sVar1 - 1] == ':') {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(__stream," %s",pcVar3);
    }
  }
  fprintf(_stderr,"\n");
  exit(2);
}

Assistant:

void eprintf(const char *fmt, const char *file, int line, ...)
{
    va_list args;

    fflush(stderr);

    fprintf(stderr, "%s:%d: ", file, line);
    va_start(args, line);
    vfprintf(stderr, fmt, args);
    va_end(args);

    /*include system error information if format ends in colon */
    if(fmt[0] != '\0' && fmt[strlen(fmt) - 1] == ':')
        fprintf(stderr, " %s", strerror(errno));
    fprintf(stderr, "\n");

    exit(2);
}